

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O0

void __thiscall Omega_h::MetricEdgeLengths<2,_2>::~MetricEdgeLengths(MetricEdgeLengths<2,_2> *this)

{
  MetricEdgeLengths<3,_3> *this_local;
  
  Read<double>::~Read(&this->metrics);
  Read<double>::~Read(&this->coords);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}